

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O1

int glob_match_url(char **result,char *filename,URLGlob *glob)

{
  URLPatternType UVar1;
  anon_struct_8_4_a75b1b66_for_CharRange aVar2;
  bool bVar3;
  char *__ptr;
  ushort **ppuVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  char *__s;
  ulong uVar9;
  size_t __n;
  char numbuf [18];
  int local_74;
  char *local_70;
  size_t local_68;
  char **local_60;
  URLPattern *local_58;
  URLGlob *local_50;
  char local_48 [24];
  
  *result = (char *)0x0;
  local_70 = filename;
  local_68 = strlen(filename);
  local_68 = local_68 + 1;
  __ptr = (char *)malloc(local_68);
  if (__ptr == (char *)0x0) {
    return 0x1b;
  }
  local_58 = glob->pattern;
  __n = 0;
  __s = (char *)0x0;
  uVar9 = 0;
  local_60 = result;
  local_50 = glob;
  do {
    pcVar8 = local_70;
    if (*local_70 == '#') {
      ppuVar4 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar4 + (ulong)(byte)pcVar8[1] * 2 + 1) & 8) == 0) goto LAB_00112d05;
      uVar5 = strtoul(pcVar8 + 1,&local_70,10);
      uVar6 = uVar5 - 1;
      if ((uVar5 == 0) || (local_50->size >> 1 < uVar6)) {
        __n = 1;
        __s = pcVar8;
        local_70 = pcVar8 + 1;
LAB_00112d55:
        bVar3 = true;
      }
      else {
        UVar1 = local_58[uVar6].type;
        if (UVar1 == UPTNumRange) {
          __s = local_48;
          curl_msnprintf(__s,0x12,"%0*d",(int)local_58[uVar6].content.Set.size,
                         local_58[uVar6].content.NumRange.ptr_n);
          __n = strlen(__s);
          goto LAB_00112d55;
        }
        aVar2 = local_58[uVar6].content.CharRange;
        if (UVar1 == UPTCharRange) {
          local_48[0] = aVar2.ptr_c;
          local_48[1] = 0;
          __n = 1;
          bVar3 = true;
          __s = local_48;
        }
        else if (UVar1 == UPTSet) {
          bVar3 = true;
          if (aVar2 != (anon_struct_8_4_a75b1b66_for_CharRange)0x0) {
            __s = *(char **)((long)aVar2 + (long)local_58[uVar6].content.Set.ptr_s * 8);
            __n = strlen(__s);
          }
        }
        else {
          curl_mprintf("internal error: invalid pattern type (%d)\n");
          local_74 = 2;
          if (__ptr != (char *)0x0) {
            free(__ptr);
          }
          bVar3 = false;
          __ptr = (char *)0x0;
        }
      }
      if (!bVar3) {
        return local_74;
      }
    }
    else {
      if (*local_70 == '\0') {
        __ptr[uVar9] = '\0';
        *local_60 = __ptr;
        return 0;
      }
LAB_00112d05:
      local_70 = pcVar8 + 1;
      __n = 1;
      __s = pcVar8;
    }
    uVar5 = __n + uVar9;
    if (local_68 <= uVar5) {
      pcVar7 = (char *)realloc(__ptr,uVar5 * 2 + 1);
      pcVar8 = pcVar7;
      if (pcVar7 == (char *)0x0) {
        local_74 = 0x1b;
        if (__ptr != (char *)0x0) {
          free(__ptr);
        }
        pcVar8 = (char *)0x0;
      }
      if (pcVar7 == (char *)0x0) {
        return local_74;
      }
      local_68 = uVar5 * 2;
      __ptr = pcVar8;
    }
    memcpy(__ptr + uVar9,__s,__n);
    uVar9 = uVar5;
  } while( true );
}

Assistant:

int glob_match_url(char **result, char *filename, URLGlob *glob)
{
  char *target;
  size_t allocsize;
  char numbuf[18];
  char *appendthis = NULL;
  size_t appendlen = 0;
  size_t stringlen = 0;

  *result = NULL;

  /* We cannot use the glob_buffer for storage here since the filename may
   * be longer than the URL we use. We allocate a good start size, then
   * we need to realloc in case of need.
   */
  allocsize = strlen(filename) + 1; /* make it at least one byte to store the
                                       trailing zero */
  target = malloc(allocsize);
  if(!target)
    return CURLE_OUT_OF_MEMORY;

  while(*filename) {
    if(*filename == '#' && ISDIGIT(filename[1])) {
      unsigned long i;
      char *ptr = filename;
      unsigned long num = strtoul(&filename[1], &filename, 10);
      i = num - 1UL;

      if(num && (i <= glob->size / 2)) {
        URLPattern pat = glob->pattern[i];
        switch (pat.type) {
        case UPTSet:
          if(pat.content.Set.elements) {
            appendthis = pat.content.Set.elements[pat.content.Set.ptr_s];
            appendlen =
              strlen(pat.content.Set.elements[pat.content.Set.ptr_s]);
          }
          break;
        case UPTCharRange:
          numbuf[0] = pat.content.CharRange.ptr_c;
          numbuf[1] = 0;
          appendthis = numbuf;
          appendlen = 1;
          break;
        case UPTNumRange:
          snprintf(numbuf, sizeof(numbuf), "%0*d",
                   pat.content.NumRange.padlength,
                   pat.content.NumRange.ptr_n);
          appendthis = numbuf;
          appendlen = strlen(numbuf);
          break;
        default:
          printf("internal error: invalid pattern type (%d)\n",
                 (int)pat.type);
          Curl_safefree(target);
          return CURLE_FAILED_INIT;
        }
      }
      else {
        /* #[num] out of range, use the #[num] in the output */
        filename = ptr;
        appendthis = filename++;
        appendlen = 1;
      }
    }
    else {
      appendthis = filename++;
      appendlen = 1;
    }
    if(appendlen + stringlen >= allocsize) {
      char *newstr;
      /* we append a single byte to allow for the trailing byte to be appended
         at the end of this function outside the while() loop */
      allocsize = (appendlen + stringlen) * 2;
      newstr = realloc(target, allocsize + 1);
      if(!newstr) {
        Curl_safefree(target);
        return CURLE_OUT_OF_MEMORY;
      }
      target = newstr;
    }
    memcpy(&target[stringlen], appendthis, appendlen);
    stringlen += appendlen;
  }
  target[stringlen]= '\0';
  *result = target;
  return CURLE_OK;
}